

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O0

bool double_conversion::DoubleStrtod(Vector<const_char> trimmed,int exponent,double *result)

{
  Vector<const_char> buffer;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  int iVar1;
  uint64_t uVar2;
  double *in_RCX;
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int remaining_digits;
  int read_digits;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  Vector<const_char> local_18;
  
  local_18.start_ = in_RDI;
  local_18.length_ = in_ESI;
  iVar1 = Vector<const_char>::length(&local_18);
  if (iVar1 < 0x10) {
    if ((in_EDX < 0) && (-in_EDX < 0x17)) {
      buffer._8_8_ = in_stack_ffffffffffffffb0;
      buffer.start_ = in_stack_ffffffffffffffa8;
      uVar2 = ReadUint64(buffer,(int *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                        );
      auVar3._8_4_ = (int)(uVar2 >> 0x20);
      auVar3._0_8_ = uVar2;
      auVar3._12_4_ = 0x45300000;
      *in_RCX = (auVar3._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
      *in_RCX = *in_RCX / *(double *)(exact_powers_of_ten + (long)-in_EDX * 8);
      return true;
    }
    if ((-1 < in_EDX) && (in_EDX < 0x17)) {
      buffer_00._12_4_ = local_18._12_4_;
      buffer_00.length_ = local_18.length_;
      buffer_00.start_ = local_18.start_;
      uVar2 = ReadUint64(buffer_00,
                         (int *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      auVar4._8_4_ = (int)(uVar2 >> 0x20);
      auVar4._0_8_ = uVar2;
      auVar4._12_4_ = 0x45300000;
      *in_RCX = (auVar4._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
      *in_RCX = *(double *)(exact_powers_of_ten + (long)in_EDX * 8) * *in_RCX;
      return true;
    }
    iVar1 = Vector<const_char>::length(&local_18);
    iVar1 = 0xf - iVar1;
    if ((-1 < in_EDX) && (in_EDX - iVar1 < 0x17)) {
      buffer_01._8_8_ = in_stack_ffffffffffffffb0;
      buffer_01.start_ = in_stack_ffffffffffffffa8;
      uVar2 = ReadUint64(buffer_01,(int *)CONCAT44(iVar1,in_stack_ffffffffffffffa0));
      auVar5._8_4_ = (int)(uVar2 >> 0x20);
      auVar5._0_8_ = uVar2;
      auVar5._12_4_ = 0x45300000;
      *in_RCX = (auVar5._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
      *in_RCX = *(double *)(exact_powers_of_ten + (long)iVar1 * 8) * *in_RCX;
      *in_RCX = *(double *)(exact_powers_of_ten + (long)(in_EDX - iVar1) * 8) * *in_RCX;
      return true;
    }
  }
  return false;
}

Assistant:

static bool DoubleStrtod(Vector<const char> trimmed,
                         int exponent,
                         double* result) {
#if !defined(DOUBLE_CONVERSION_CORRECT_DOUBLE_OPERATIONS)
  // On x86 the floating-point stack can be 64 or 80 bits wide. If it is
  // 80 bits wide (as is the case on Linux) then double-rounding occurs and the
  // result is not accurate.
  // We know that Windows32 uses 64 bits and is therefore accurate.
  // Note that the ARM simulator is compiled for 32bits. It therefore exhibits
  // the same problem.
  return false;
#else
  if (trimmed.length() <= kMaxExactDoubleIntegerDecimalDigits) {
    int read_digits;
    // The trimmed input fits into a double.
    // If the 10^exponent (resp. 10^-exponent) fits into a double too then we
    // can compute the result-double simply by multiplying (resp. dividing) the
    // two numbers.
    // This is possible because IEEE guarantees that floating-point operations
    // return the best possible approximation.
    if (exponent < 0 && -exponent < kExactPowersOfTenSize) {
      // 10^-exponent fits into a double.
      *result = static_cast<double>(ReadUint64(trimmed, &read_digits));
      DOUBLE_CONVERSION_ASSERT(read_digits == trimmed.length());
      *result /= exact_powers_of_ten[-exponent];
      return true;
    }
    if (0 <= exponent && exponent < kExactPowersOfTenSize) {
      // 10^exponent fits into a double.
      *result = static_cast<double>(ReadUint64(trimmed, &read_digits));
      DOUBLE_CONVERSION_ASSERT(read_digits == trimmed.length());
      *result *= exact_powers_of_ten[exponent];
      return true;
    }
    int remaining_digits =
        kMaxExactDoubleIntegerDecimalDigits - trimmed.length();
    if ((0 <= exponent) &&
        (exponent - remaining_digits < kExactPowersOfTenSize)) {
      // The trimmed string was short and we can multiply it with
      // 10^remaining_digits. As a result the remaining exponent now fits
      // into a double too.
      *result = static_cast<double>(ReadUint64(trimmed, &read_digits));
      DOUBLE_CONVERSION_ASSERT(read_digits == trimmed.length());
      *result *= exact_powers_of_ten[remaining_digits];
      *result *= exact_powers_of_ten[exponent - remaining_digits];
      return true;
    }
  }
  return false;
#endif
}